

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int tinyexr::CeilLog2(uint x)

{
  undefined4 local_14;
  undefined4 local_10;
  int r;
  int y;
  uint x_local;
  
  local_10 = 0;
  local_14 = 0;
  for (r = x; 1 < (uint)r; r = (uint)r >> 1) {
    if ((r & 1U) != 0) {
      local_14 = 1;
    }
    local_10 = local_10 + 1;
  }
  return local_10 + local_14;
}

Assistant:

static int CeilLog2(unsigned x) {
  //
  // For x > 0, ceilLog2(y) returns ceil(log(x)/log(2)).
  //
  int y = 0;
  int r = 0;
  while (x > 1) {
    if (x & 1)
      r = 1;

    y += 1;
    x >>= 1u;
  }
  return y + r;
}